

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::LoopLayerParams::ByteSizeLong(LoopLayerParams *this)

{
  string *value;
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  
  value = (this->conditionvar_).ptr_;
  if (value->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar2 = sVar2 + 1;
  }
  if (this->conditionnetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>(this->conditionnetwork_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->bodynetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)&_LoopLayerParams_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::NeuralNetwork>(this->bodynetwork_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->maxloopiterations_ != 0) {
    uVar4 = this->maxloopiterations_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar2 = sVar2 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t LoopLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LoopLayerParams)
  size_t total_size = 0;

  // string conditionVar = 2;
  if (this->conditionvar().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->conditionvar());
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->has_conditionnetwork()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->conditionnetwork_);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->has_bodynetwork()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bodynetwork_);
  }

  // uint64 maxLoopIterations = 1;
  if (this->maxloopiterations() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->maxloopiterations());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}